

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

bool __thiscall tf::Executor::_wait_for_task(Executor *this,Worker *worker,Node **t)

{
  bool bVar1;
  atomic<unsigned_long> *paVar2;
  Node *pNVar3;
  __int_type_conflict _Var4;
  reference pWVar5;
  Worker *w;
  iterator __end2;
  iterator __begin2;
  vector<tf::Worker,_std::allocator<tf::Worker>_> *__range2;
  Node **t_local;
  Worker *worker_local;
  Executor *this_local;
  
  while( true ) {
    std::__atomic_base<unsigned_long>::operator++
              (&(this->_num_thieves).super___atomic_base<unsigned_long>);
    while( true ) {
      _explore_task(this,worker,t);
      if (*t != (Node *)0x0) {
        paVar2 = &this->_num_thieves;
        LOCK();
        _Var4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        if (_Var4 == 1) {
          Notifier::notify(&this->_notifier,false);
        }
        return true;
      }
      Notifier::prepare_wait(&this->_notifier,worker->_waiter);
      bVar1 = TaskQueue<tf::Node_*>::empty(&this->_wsq);
      if (bVar1) break;
      Notifier::cancel_wait(&this->_notifier,worker->_waiter);
      pNVar3 = TaskQueue<tf::Node_*>::steal(&this->_wsq);
      *t = pNVar3;
      if (*t != (Node *)0x0) {
        paVar2 = &this->_num_thieves;
        LOCK();
        _Var4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i - 1;
        UNLOCK();
        if (_Var4 == 1) {
          Notifier::notify(&this->_notifier,false);
        }
        return true;
      }
      worker->_vtm = worker->_id;
    }
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->_done);
    if (bVar1) {
      Notifier::cancel_wait(&this->_notifier,worker->_waiter);
      Notifier::notify(&this->_notifier,true);
      std::__atomic_base<unsigned_long>::operator--
                (&(this->_num_thieves).super___atomic_base<unsigned_long>);
      return false;
    }
    paVar2 = &this->_num_thieves;
    LOCK();
    _Var4 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (_Var4 != 1) break;
    _Var4 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->_num_actives)
    ;
    if (_Var4 == 0) {
      __end2 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::begin(&this->_workers);
      w = (Worker *)std::vector<tf::Worker,_std::allocator<tf::Worker>_>::end(&this->_workers);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
                          (&__end2,(__normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
                                    *)&w);
        if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001a209e;
        pWVar5 = __gnu_cxx::
                 __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>
                 ::operator*(&__end2);
        bVar1 = TaskQueue<tf::Node_*>::empty(&pWVar5->_wsq);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<tf::Worker_*,_std::vector<tf::Worker,_std::allocator<tf::Worker>_>_>::
        operator++(&__end2);
      }
      worker->_vtm = pWVar5->_id;
      Notifier::cancel_wait(&this->_notifier,worker->_waiter);
    }
    else {
      Notifier::cancel_wait(&this->_notifier,worker->_waiter);
    }
  }
LAB_001a209e:
  Notifier::commit_wait(&this->_notifier,worker->_waiter);
  return true;
}

Assistant:

inline bool Executor::_wait_for_task(Worker& worker, Node*& t) {

  wait_for_task:

  //assert(!t);

  ++_num_thieves;

  explore_task:

  _explore_task(worker, t);

  if(t) {
    if(_num_thieves.fetch_sub(1) == 1) {
      _notifier.notify(false);
    }
    return true;
  }

  _notifier.prepare_wait(worker._waiter);

  //if(auto vtm = _find_vtm(me); vtm != _workers.size()) {
  if(!_wsq.empty()) {

    _notifier.cancel_wait(worker._waiter);
    //t = (vtm == me) ? _wsq.steal() : _workers[vtm].wsq.steal();

    t = _wsq.steal();  // must steal here
    if(t) {
      if(_num_thieves.fetch_sub(1) == 1) {
        _notifier.notify(false);
      }
      return true;
    }
    else {
      worker._vtm = worker._id;
      goto explore_task;
    }
  }

  if(_done) {
    _notifier.cancel_wait(worker._waiter);
    _notifier.notify(true);
    --_num_thieves;
    return false;
  }

  if(_num_thieves.fetch_sub(1) == 1) {
    if(_num_actives) {
      _notifier.cancel_wait(worker._waiter);
      goto wait_for_task;
    }
    // check all queues again
    for(auto& w : _workers) {
      if(!w._wsq.empty()) {
        worker._vtm = w._id;
        _notifier.cancel_wait(worker._waiter);
        goto wait_for_task;
      }
    }
  }

  // Now I really need to relinguish my self to others
  _notifier.commit_wait(worker._waiter);

  return true;
}